

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O1

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::maybe<std::__cxx11::string,void>::operator=
          (maybe<std::__cxx11::string,void> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  long *local_38 [2];
  long local_28 [2];
  
  if (*this == (maybe<std::__cxx11::string,void>)0x1) {
    pcVar1 = (other->_M_dataplus)._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar1,pcVar1 + other->_M_string_length);
    pbVar2 = value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>
                       ((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)this);
    std::__cxx11::string::swap((string *)pbVar2);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  else {
    *(maybe<std::__cxx11::string,void> **)(this + 8) = this + 0x18;
    pcVar1 = (other->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(this + 8),pcVar1,pcVar1 + other->_M_string_length);
    *this = (maybe<std::__cxx11::string,void>)0x1;
  }
  return (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }